

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

void __thiscall Assimp::STEP::DB::~DB(DB *this)

{
  LazyObject *this_00;
  bool bVar1;
  reference ppVar2;
  value_type *o;
  iterator __end2;
  iterator __begin2;
  ObjectMap *__range2;
  DB *this_local;
  
  __end2 = std::
           map<unsigned_long,_const_Assimp::STEP::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>_>
           ::begin(&this->objects);
  o = (value_type *)
      std::
      map<unsigned_long,_const_Assimp::STEP::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>_>
      ::end(&this->objects);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&o);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>::
             operator*(&__end2);
    this_00 = ppVar2->second;
    if (this_00 != (LazyObject *)0x0) {
      LazyObject::~LazyObject(this_00);
      operator_delete(this_00,0x28);
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>::
    operator++(&__end2);
  }
  LineSplitter::~LineSplitter(&this->splitter);
  std::shared_ptr<Assimp::StreamReader<false,_false>_>::~shared_ptr(&this->reader);
  std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::~set
            (&this->inv_whitelist);
  std::
  multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~multimap(&this->refs);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
  ::~map(&this->objects_bytype);
  std::
  map<unsigned_long,_const_Assimp::STEP::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>_>
  ::~map(&this->objects);
  HeaderInfo::~HeaderInfo(&this->header);
  return;
}

Assistant:

~DB() {
            for(ObjectMap::value_type& o : objects) {
                delete o.second;
            }
        }